

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O1

DdManager * Llb_ManConstructGlobalBdds(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  ulong uVar3;
  DdManager *unique;
  DdNode *pDVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  unique = Cudd_Init(p->nObjs[2],0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  pAVar1 = p->pConst1;
  pDVar4 = Cudd_ReadOne(unique);
  (pAVar1->field_5).pData = pDVar4;
  Cudd_Ref(pDVar4);
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar6];
      pDVar4 = Cudd_bddIthVar(unique,(int)lVar6);
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar4;
      Cudd_Ref(pDVar4);
      lVar6 = lVar6 + 1;
      pVVar5 = p->vCis;
    } while (lVar6 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar6];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        pDVar4 = Cudd_bddAnd(unique,(DdNode *)
                                    ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                                    *(ulong *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                              0x28)),
                             (DdNode *)
                             ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                             *(ulong *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) +
                                       0x28)));
        *(DdNode **)((long)pvVar2 + 0x28) = pDVar4;
        Cudd_Ref(pDVar4);
      }
      lVar6 = lVar6 + 1;
      pVVar5 = p->vObjs;
    } while (lVar6 < pVVar5->nSize);
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      uVar3 = *(ulong *)((long)pVVar5->pArray[lVar6] + 8);
      pDVar4 = (DdNode *)
               ((ulong)((uint)uVar3 & 1) ^ *(ulong *)((uVar3 & 0xfffffffffffffffe) + 0x28));
      *(DdNode **)((long)pVVar5->pArray[lVar6] + 0x28) = pDVar4;
      Cudd_Ref(pDVar4);
      lVar6 = lVar6 + 1;
      pVVar5 = p->vCos;
    } while (lVar6 < pVVar5->nSize);
  }
  return unique;
}

Assistant:

DdManager * Llb_ManConstructGlobalBdds( Aig_Man_t * p )
{
    DdManager * dd;
    DdNode * bBdd0, * bBdd1;
    Aig_Obj_t * pObj;
    int i;
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    pObj = Aig_ManConst1(p);
    pObj->pData = Cudd_ReadOne(dd);  Cudd_Ref( (DdNode *)pObj->pData );
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Cudd_bddIthVar(dd, i);  Cudd_Ref( (DdNode *)pObj->pData );
    }
    Aig_ManForEachNode( p, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( (DdNode *)pObj->pData );
    }
    Aig_ManForEachCo( p, pObj, i )
    {
        pObj->pData = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );  Cudd_Ref( (DdNode *)pObj->pData );
    }
    return dd;
}